

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

uint8_t __thiscall AmpIO::GetAmpEnableMask(AmpIO *this)

{
  bool bVar1;
  uint32_t uVar2;
  byte bVar3;
  byte bVar4;
  uint index;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x514c4131) {
    bVar4 = (byte)this->ReadBuffer[1] & 0xf;
  }
  else {
    index = 0;
    if (this->NumMotors == 0) {
      bVar4 = 0;
    }
    else {
      bVar4 = 0;
      do {
        bVar1 = GetAmpEnable(this,index);
        bVar3 = (byte)(1 << ((byte)index & 0x1f));
        if (!bVar1) {
          bVar3 = 0;
        }
        bVar4 = bVar4 | bVar3;
        index = index + 1;
      } while (index < this->NumMotors);
    }
  }
  return bVar4;
}

Assistant:

uint8_t AmpIO::GetAmpEnableMask(void) const
{
    uint8_t ampEnable = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // For the QLA, the following is more efficient than the general case
        ampEnable = GetStatus()&0x0000000f;
    }
    else {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if (GetAmpEnable(i))
                ampEnable |= (1 << i);
        }
    }
    return ampEnable;
}